

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t tuple;
  undefined1 local_88 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_484e24cd gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x18);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
  gcFrameRecord.roots[3] = sVar3;
  local_88 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_88);
  sVar3 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                    (context,gcFrameRecord.roots[5],*psVar2);
  gcFrameRecord.roots[5] = sVar3;
  tuple = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                    (context,gcFrameRecord.roots[6],(context->roots).typeType,*psVar2);
  gcFrameRecord.roots[6] = tuple;
  sVar3 = sysbvm_astNode_getAnalyzedType(sVar3);
  gcFrameRecord.roots[4] = sVar3;
  _Var1 = sysbvm_astNode_isLiteralNode(context,tuple);
  if (_Var1) {
    sVar3 = sysbvm_astLiteralNode_getValue(tuple);
    gcFrameRecord.roots[4] = sVar3;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astTupleWithLookupStartingFromNode_t *objectWithLookupStartingFromNode;
        sysbvm_tuple_t analyzedObjectExpression;
        sysbvm_tuple_t analyzedTypeExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.objectWithLookupStartingFromNode = (sysbvm_astTupleWithLookupStartingFromNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.objectWithLookupStartingFromNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.objectWithLookupStartingFromNode->super.sourcePosition);

    gcFrame.analyzedObjectExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.objectWithLookupStartingFromNode->tupleExpression, *environment);
    gcFrame.objectWithLookupStartingFromNode->tupleExpression = gcFrame.analyzedObjectExpression;

    gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.objectWithLookupStartingFromNode->typeExpression, context->roots.typeType, *environment);
    gcFrame.objectWithLookupStartingFromNode->typeExpression = gcFrame.analyzedTypeExpression;

    gcFrame.objectWithLookupStartingFromNode->super.analyzedType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedObjectExpression);
    if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
        gcFrame.objectWithLookupStartingFromNode->super.analyzedType = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.objectWithLookupStartingFromNode;
}